

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O3

void __thiscall EPoller::addChannel(EPoller *this,ChannelPtr *channel)

{
  ChannelMap *this_00;
  int iVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  Logger local_1010;
  epoll_event local_38;
  int fd;
  
  local_38.data.u64._4_4_ =
       ((channel->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->fd_;
  this_00 = &this->channels_;
  iVar2 = std::
          _Hashtable<int,_std::pair<const_int,_std::shared_ptr<Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_00->_M_h,(key_type *)((long)&local_38.data + 4));
  if (iVar2.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Channel>_>,_false>._M_cur
      == (__node_type *)0x0) {
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::shared_ptr<Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::shared_ptr<Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,(key_type *)((long)&local_38.data + 4));
    (pmVar3->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (channel->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar3->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
               &(channel->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
    local_38.data.fd = 0;
    local_38.events =
         ((channel->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->events_;
    local_38._4_4_ = local_38.data.u64._4_4_;
    iVar1 = epoll_ctl(this->epollfd_,1,local_38.data.u64._4_4_,&local_38);
    if (iVar1 < 0) {
      Logger::Logger(&local_1010,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EPoller.cpp"
                     ,0x3a);
      if (0xf < ((int)&local_1010 + 0xfa8) - (int)local_1010.impl_.stream_.buffer_.cur_) {
        builtin_strncpy(local_1010.impl_.stream_.buffer_.cur_,"epoll_add error",0xf);
        local_1010.impl_.stream_.buffer_.cur_ = local_1010.impl_.stream_.buffer_.cur_ + 0xf;
      }
      Logger::~Logger(&local_1010);
      std::
      _Hashtable<int,_std::pair<const_int,_std::shared_ptr<Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&this_00->_M_h,(undefined1 *)((long)&local_38.data + 4));
    }
    return;
  }
  __assert_fail("channels_.find(fd) == channels_.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EPoller.cpp"
                ,0x31,"void EPoller::addChannel(ChannelPtr)");
}

Assistant:

void EPoller::addChannel(ChannelPtr channel) {
    int fd = channel->fd();
    
    assert(channels_.find(fd) == channels_.end());
    channels_[fd] = channel;

    struct epoll_event event;
    memset(&event, 0, sizeof event);
    event.events = channel->events();
    event.data.fd = fd;
    
    if (epoll_ctl(epollfd_, EPOLL_CTL_ADD, fd, &event) < 0) {
        LOG << "epoll_add error";
        channels_.erase(fd);
    }
    // LOG << "Epoll ADD fd = " << fd;
}